

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers_test.cpp
# Opt level: O0

void flatbuffers::tests::FlexBuffersFloatingPointTest(void)

{
  bool bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar2;
  uchar *buf;
  size_type_conflict buf_len;
  size_t val;
  double dVar3;
  Reference RVar4;
  Reference local_c20;
  Reference local_c10;
  Reference local_c00;
  Reference local_bf0;
  Reference local_be0;
  Reference local_bd0;
  Reference local_bc0;
  Reference local_bb0;
  Reference local_ba0;
  undefined1 local_b90 [8];
  Vector jvec;
  Map jmap;
  Reference jroot;
  char *jsontest;
  IDLOptions local_b38;
  undefined1 local_828 [8];
  Parser parser;
  Builder slb;
  
  flexbuffers::Builder::Builder
            ((Builder *)&parser.anonymous_counter_,0x200,BUILDER_FLAG_SHARE_KEYS_AND_STRINGS);
  IDLOptions::IDLOptions(&local_b38);
  Parser::Parser((Parser *)local_828,&local_b38);
  IDLOptions::~IDLOptions(&local_b38);
  flexbuffers::Builder::Clear((Builder *)&parser.anonymous_counter_);
  bVar1 = Parser::ParseFlexBuffer
                    ((Parser *)local_828,
                     "{ a: [1.0, nan, inf, infinity, -inf, +inf, -infinity, 8.0] }",(char *)0x0,
                     (Builder *)&parser.anonymous_counter_);
  TestEq<bool,bool>(bVar1,true,"\'parser.ParseFlexBuffer(jsontest, nullptr, &slb)\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
                    ,0xb5,"");
  pvVar2 = flexbuffers::Builder::GetBuffer((Builder *)&parser.anonymous_counter_);
  RVar4 = flexbuffers::GetRoot(pvVar2);
  jmap.super_Vector.super_Sized.size_ = (size_t)RVar4.data_;
  pvVar2 = flexbuffers::Builder::GetBuffer((Builder *)&parser.anonymous_counter_);
  buf = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(pvVar2);
  pvVar2 = flexbuffers::Builder::GetBuffer((Builder *)&parser.anonymous_counter_);
  buf_len = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar2);
  bVar1 = flexbuffers::VerifyBuffer
                    (buf,buf_len,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0);
  TestEq<bool,bool>(bVar1,true,
                    "\'flexbuffers::VerifyBuffer(slb.GetBuffer().data(), slb.GetBuffer().size(), nullptr)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
                    ,0xb9,"");
  flexbuffers::Reference::AsMap
            ((Map *)&jvec.super_Sized.size_,(Reference *)&jmap.super_Vector.super_Sized.size_);
  local_ba0 = flexbuffers::Map::operator[]((Map *)&jvec.super_Sized.size_,"a");
  flexbuffers::Reference::AsVector((Vector *)local_b90,&local_ba0);
  val = flexbuffers::Sized::size((Sized *)local_b90);
  TestEq<int,unsigned_long>
            (8,val,"\'8\' != \'jvec.size()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
             ,0xbc,"");
  local_bb0 = flexbuffers::Vector::operator[]((Vector *)local_b90,0);
  dVar3 = flexbuffers::Reference::AsDouble(&local_bb0);
  TestEq<double,double>
            (1.0,dVar3,"\'1.0\' != \'jvec[0].AsDouble()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
             ,0xbd,"");
  local_bc0 = flexbuffers::Vector::operator[]((Vector *)local_b90,1);
  dVar3 = flexbuffers::Reference::AsDouble(&local_bc0);
  bVar1 = is_quiet_nan(dVar3);
  TestEq<bool,bool>(true,bVar1,"\'true\' != \'is_quiet_nan(jvec[1].AsDouble())\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
                    ,0xbe,"");
  local_bd0 = flexbuffers::Vector::operator[]((Vector *)local_b90,2);
  dVar3 = flexbuffers::Reference::AsDouble(&local_bd0);
  TestEq<double,double>
            (INFINITY,dVar3,"\'infinity_d\' != \'jvec[2].AsDouble()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
             ,0xbf,"");
  local_be0 = flexbuffers::Vector::operator[]((Vector *)local_b90,3);
  dVar3 = flexbuffers::Reference::AsDouble(&local_be0);
  TestEq<double,double>
            (INFINITY,dVar3,"\'infinity_d\' != \'jvec[3].AsDouble()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
             ,0xc0,"");
  local_bf0 = flexbuffers::Vector::operator[]((Vector *)local_b90,4);
  dVar3 = flexbuffers::Reference::AsDouble(&local_bf0);
  TestEq<double,double>
            (-INFINITY,dVar3,"\'-infinity_d\' != \'jvec[4].AsDouble()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
             ,0xc1,"");
  local_c00 = flexbuffers::Vector::operator[]((Vector *)local_b90,5);
  dVar3 = flexbuffers::Reference::AsDouble(&local_c00);
  TestEq<double,double>
            (INFINITY,dVar3,"\'+infinity_d\' != \'jvec[5].AsDouble()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
             ,0xc2,"");
  local_c10 = flexbuffers::Vector::operator[]((Vector *)local_b90,6);
  dVar3 = flexbuffers::Reference::AsDouble(&local_c10);
  TestEq<double,double>
            (-INFINITY,dVar3,"\'-infinity_d\' != \'jvec[6].AsDouble()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
             ,0xc3,"");
  local_c20 = flexbuffers::Vector::operator[]((Vector *)local_b90,7);
  dVar3 = flexbuffers::Reference::AsDouble(&local_c20);
  TestEq<double,double>
            (8.0,dVar3,"\'8.0\' != \'jvec[7].AsDouble()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
             ,0xc4,"");
  Parser::~Parser((Parser *)local_828);
  flexbuffers::Builder::~Builder((Builder *)&parser.anonymous_counter_);
  return;
}

Assistant:

void FlexBuffersFloatingPointTest() {
#if defined(FLATBUFFERS_HAS_NEW_STRTOD) && (FLATBUFFERS_HAS_NEW_STRTOD > 0)
  flexbuffers::Builder slb(512,
                           flexbuffers::BUILDER_FLAG_SHARE_KEYS_AND_STRINGS);
  // Parse floating-point values from JSON:
  flatbuffers::Parser parser;
  slb.Clear();
  auto jsontest =
      "{ a: [1.0, nan, inf, infinity, -inf, +inf, -infinity, 8.0] }";
  TEST_EQ(parser.ParseFlexBuffer(jsontest, nullptr, &slb), true);
  auto jroot = flexbuffers::GetRoot(slb.GetBuffer());
  TEST_EQ(flexbuffers::VerifyBuffer(slb.GetBuffer().data(),
                                    slb.GetBuffer().size(), nullptr),
          true);
  auto jmap = jroot.AsMap();
  auto jvec = jmap["a"].AsVector();
  TEST_EQ(8, jvec.size());
  TEST_EQ(1.0, jvec[0].AsDouble());
  TEST_ASSERT(is_quiet_nan(jvec[1].AsDouble()));
  TEST_EQ(infinity_d, jvec[2].AsDouble());
  TEST_EQ(infinity_d, jvec[3].AsDouble());
  TEST_EQ(-infinity_d, jvec[4].AsDouble());
  TEST_EQ(+infinity_d, jvec[5].AsDouble());
  TEST_EQ(-infinity_d, jvec[6].AsDouble());
  TEST_EQ(8.0, jvec[7].AsDouble());
#endif
}